

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_TEXLD(Context *ctx)

{
  uint32 uVar1;
  byte bVar2;
  char *opcode;
  
  bVar2 = 0;
  if (ctx->minor_ver != 0xff) {
    bVar2 = ctx->minor_ver;
  }
  if (0x10003 < ((uint)bVar2 | (uint)ctx->major_ver << 0x10)) {
    if (ctx->major_ver < 2) {
      failf(ctx,"%s","TEXLD == Shader Model 1.4 unimplemented.");
      return;
    }
    uVar1 = ctx->instruction_controls;
    if (uVar1 == 2) {
      opcode = "TXB";
      goto LAB_00115b22;
    }
    if (uVar1 == 1) {
      opcode = "TXP";
      goto LAB_00115b22;
    }
    if (uVar1 != 0) {
      return;
    }
  }
  opcode = "TEX";
LAB_00115b22:
  arb1_texld(ctx,opcode,0);
  return;
}

Assistant:

EMIT_ARB1_OPCODE_UNIMPLEMENTED_FUNC(TEXCRD)

static void emit_ARB1_TEXLD(Context *ctx)
{
    if (!shader_version_atleast(ctx, 1, 4))
    {
        arb1_texld(ctx, "TEX", 0);
        return;
    } // if

    else if (!shader_version_atleast(ctx, 2, 0))
    {
        // ps_1_4 is different, too!
        fail(ctx, "TEXLD == Shader Model 1.4 unimplemented.");  // !!! FIXME
        return;
    } // if

    // !!! FIXME: do texldb and texldp map between OpenGL and D3D correctly?
    if (ctx->instruction_controls == CONTROL_TEXLD)
        arb1_texld(ctx, "TEX", 0);
    else if (ctx->instruction_controls == CONTROL_TEXLDP)
        arb1_texld(ctx, "TXP", 0);
    else if (ctx->instruction_controls == CONTROL_TEXLDB)
        arb1_texld(ctx, "TXB", 0);
}